

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

uint parse_hex4(uchar *input)

{
  int iVar1;
  ulong local_28;
  size_t i;
  uint h;
  uchar *input_local;
  
  i._4_4_ = 0;
  local_28 = 0;
  do {
    if (3 < local_28) {
      return i._4_4_;
    }
    if ((input[local_28] < 0x30) || (0x39 < input[local_28])) {
      if ((input[local_28] < 0x41) || (0x46 < input[local_28])) {
        if ((input[local_28] < 0x61) || (0x66 < input[local_28])) {
          return 0;
        }
        iVar1 = input[local_28] - 0x57;
      }
      else {
        iVar1 = input[local_28] - 0x37;
      }
    }
    else {
      iVar1 = input[local_28] - 0x30;
    }
    i._4_4_ = iVar1 + i._4_4_;
    if (local_28 < 3) {
      i._4_4_ = i._4_4_ * 0x10;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

static unsigned parse_hex4(const unsigned char * const input)
{
    unsigned int h = 0;
    size_t i = 0;

    for (i = 0; i < 4; i++)
    {
        /* parse digit */
        if ((input[i] >= '0') && (input[i] <= '9'))
        {
            h += (unsigned int) input[i] - '0';
        }
        else if ((input[i] >= 'A') && (input[i] <= 'F'))
        {
            h += (unsigned int) 10 + input[i] - 'A';
        }
        else if ((input[i] >= 'a') && (input[i] <= 'f'))
        {
            h += (unsigned int) 10 + input[i] - 'a';
        }
        else /* invalid */
        {
            return 0;
        }

        if (i < 3)
        {
            /* shift left to make place for the next nibble */
            h = h << 4;
        }
    }

    return h;
}